

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_load_certificates(ptls_context_t *ctx,char *cert_pem_file)

{
  void *pvVar1;
  long in_RDI;
  int ret;
  size_t *in_stack_00000020;
  size_t in_stack_00000028;
  ptls_iovec_t *in_stack_00000030;
  char *in_stack_00000038;
  char *in_stack_00000040;
  undefined4 local_14;
  
  pvVar1 = malloc(0x100);
  *(void **)(in_RDI + 0x20) = pvVar1;
  if (*(long *)(in_RDI + 0x20) == 0) {
    local_14 = 0x201;
  }
  else {
    local_14 = ptls_load_pem_objects
                         (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                          in_stack_00000020);
  }
  return local_14;
}

Assistant:

int ptls_load_certificates(ptls_context_t *ctx, char const *cert_pem_file)
{
    int ret = 0;

    ctx->certificates.list = (ptls_iovec_t *)malloc(PTLS_MAX_CERTS_IN_CONTEXT * sizeof(ptls_iovec_t));

    if (ctx->certificates.list == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
    } else {
        ret = ptls_load_pem_objects(cert_pem_file, "CERTIFICATE", ctx->certificates.list, PTLS_MAX_CERTS_IN_CONTEXT,
                                    &ctx->certificates.count);
    }

    return ret;
}